

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O1

bool __thiscall
duckdb_re2::Prog::SearchOnePass
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  byte *pbVar10;
  uint *puVar11;
  uint uVar12;
  bool bVar13;
  byte *p;
  ulong uVar14;
  StringPiece context;
  char *matchcap [10];
  char *cap [10];
  MatchKind local_274;
  StringPiece local_258;
  byte *local_240;
  uint local_238;
  int local_234;
  uint *local_230;
  ulong local_228;
  size_t local_220;
  StringPiece *local_218;
  uint *local_210;
  byte *local_208 [10];
  byte *local_1b8;
  ostringstream local_1b0 [8];
  undefined8 local_1a8 [13];
  ios_base local_140 [272];
  
  if (kind == kFullMatch || anchor == kAnchored) {
    uVar9 = nmatch * 2;
    uVar14 = 2;
    if (2 < (int)uVar9) {
      uVar14 = (ulong)uVar9;
    }
    switchD_01306cb1::default(&local_1b8,0,uVar14 * 8);
    switchD_01306cb1::default(local_208,0,uVar14 * 8);
    local_258.data_ = const_context->data_;
    local_258.size_ = const_context->size_;
    if (local_258.data_ == (const_pointer)0x0) {
      local_258.data_ = text->data_;
      local_258.size_ = text->size_;
    }
    if ((this->anchor_start_ != true) || (local_258.data_ == text->data_)) {
      local_274 = kind;
      if (this->anchor_end_ == true) {
        if (local_258.data_ + local_258.size_ != text->data_ + text->size_) goto LAB_0185ffcf;
        local_274 = kFullMatch;
      }
      puVar11 = (uint *)(this->onepass_nodes_).ptr_._M_t.
                        super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      p = (byte *)text->data_;
      local_208[0] = p;
      local_1b8 = p;
      local_238 = uVar9;
      local_228 = uVar14;
      local_218 = match;
      if ((long)text->size_ < 1) {
        bVar13 = false;
      }
      else {
        local_234 = this->bytemap_range_ * 4 + 4;
        pbVar10 = p + text->size_;
        uVar5 = 3;
        if (3 < (int)uVar9) {
          uVar5 = uVar9;
        }
        local_220 = (ulong)(uVar5 - 2) << 3;
        bVar13 = false;
        uVar9 = *puVar11;
        local_240 = pbVar10;
        local_210 = puVar11;
        do {
          uVar5 = puVar11[(ulong)this->bytemap_[*p] + 1];
          if (((uVar5 & 0x3f) == 0) ||
             (uVar6 = EmptyFlags(&local_258,(char *)p), pbVar10 = local_240,
             (uVar5 & 0x3f & ~uVar6) == 0)) {
            lVar8 = (long)(int)((uVar5 >> 0x10) * local_234);
            puVar11 = (uint *)((long)local_210 + lVar8);
            uVar12 = *(uint *)((long)local_210 + lVar8);
          }
          else {
            uVar12 = 0x30;
            puVar11 = (uint *)0x0;
          }
          bVar3 = bVar13;
          if ((((local_274 == kFullMatch) || (uVar9 == 0x30)) ||
              ((uVar12 & 0x3f) == 0 && (uVar5 & 0x40) == 0)) ||
             ((local_230 = puVar11, (uVar9 & 0x3f) != 0 &&
              (uVar6 = EmptyFlags(&local_258,(char *)p), pbVar10 = local_240, puVar11 = local_230,
              (uVar9 & 0x3f & ~uVar6) != 0)))) {
LAB_0185fe78:
            bVar13 = bVar3;
            if (puVar11 == (uint *)0x0) {
              bVar4 = 0xf;
            }
            else {
              bVar4 = 0;
              if ((1 < nmatch) && ((uVar5 & 0x7f80) != 0)) {
                uVar7 = 2;
                do {
                  if ((uVar5 >> ((byte)uVar7 & 0x1f) & 0x20) != 0) {
                    *(byte **)(local_1b0 + uVar7 * 8 + -8) = p;
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar14 != uVar7);
              }
            }
          }
          else {
            if ((1 < nmatch) &&
               (switchD_012dd528::default(local_208 + 2,local_1a8,local_220), pbVar10 = local_240,
               (uVar9 & 0x7f80) != 0)) {
              uVar7 = 2;
              do {
                if ((uVar9 >> ((byte)uVar7 & 0x1f) & 0x20) != 0) {
                  local_208[uVar7] = p;
                }
                uVar7 = uVar7 + 1;
              } while (uVar14 != uVar7);
            }
            local_208[1] = p;
            bVar13 = true;
            puVar11 = local_230;
            bVar3 = bVar13;
            if ((local_274 != kFirstMatch) || (bVar4 = 0xf, bVar3 = true, (uVar5 & 0x40) == 0))
            goto LAB_0185fe78;
          }
          if (bVar4 != 0) {
            if (bVar4 == 0xf) goto LAB_0185ff93;
            goto LAB_0185ffd1;
          }
          p = p + 1;
          uVar9 = uVar12;
        } while (p < pbVar10);
      }
      uVar9 = *puVar11;
      if ((uVar9 != 0x30) &&
         (((uVar9 & 0x3f) == 0 ||
          (uVar6 = EmptyFlags(&local_258,(char *)p), (uVar9 & 0x3f & ~uVar6) == 0)))) {
        if ((1 < nmatch) && ((uVar9 & 0x7f80) != 0)) {
          uVar14 = 2;
          do {
            if ((uVar9 >> ((byte)uVar14 & 0x1f) & 0x20) != 0) {
              *(byte **)(local_1b0 + uVar14 * 8 + -8) = p;
            }
            uVar14 = uVar14 + 1;
          } while ((local_228 & 0xffffffff) != uVar14);
        }
        if (1 < nmatch) {
          uVar9 = 3;
          if (3 < (int)local_238) {
            uVar9 = local_238;
          }
          switchD_012dd528::default(local_208 + 2,local_1a8,(ulong)(uVar9 - 2) << 3);
        }
        local_208[1] = p;
        bVar13 = true;
      }
LAB_0185ff93:
      if (bVar13) {
        bVar4 = 1;
        if (0 < nmatch) {
          lVar8 = 0;
          do {
            lVar1 = *(long *)((long)local_208 + lVar8);
            lVar2 = *(long *)((long)local_208 + lVar8 + 8);
            *(long *)((long)&local_218->data_ + lVar8) = lVar1;
            *(long *)((long)&local_218->size_ + lVar8) = lVar2 - lVar1;
            lVar8 = lVar8 + 0x10;
          } while ((ulong)(uint)nmatch << 4 != lVar8);
        }
        goto LAB_0185ffd1;
      }
    }
  }
  else {
    local_1b8 = (byte *)((ulong)local_1b8 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,"Cannot use SearchOnePass for unanchored matches.",0x30);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    std::ios_base::~ios_base(local_140);
  }
LAB_0185ffcf:
  bVar4 = 0;
LAB_0185ffd1:
  return (bool)(bVar4 & 1);
}

Assistant:

bool Prog::SearchOnePass(const StringPiece& text,
                         const StringPiece& const_context,
                         Anchor anchor, MatchKind kind,
                         StringPiece* match, int nmatch) {
  if (anchor != kAnchored && kind != kFullMatch) {
    LOG(DFATAL) << "Cannot use SearchOnePass for unanchored matches.";
    return false;
  }

  // Make sure we have at least cap[1],
  // because we use it to tell if we matched.
  int ncap = 2*nmatch;
  if (ncap < 2)
    ncap = 2;

  const char* cap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    cap[i] = NULL;

  const char* matchcap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    matchcap[i] = NULL;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;
  if (anchor_start() && BeginPtr(context) != BeginPtr(text))
    return false;
  if (anchor_end() && EndPtr(context) != EndPtr(text))
    return false;
  if (anchor_end())
    kind = kFullMatch;

  uint8_t* nodes = onepass_nodes_.data();
  int statesize = sizeof(uint32_t) + bytemap_range()*sizeof(uint32_t);

  // start() is always mapped to the zeroth OneState.
  OneState* state = IndexToNode(nodes, statesize, 0);
  uint8_t* bytemap = bytemap_;
  const char* bp = text.data();
  const char* ep = text.data() + text.size();
  const char* p;
  bool matched = false;
  matchcap[0] = bp;
  cap[0] = bp;
  uint32_t nextmatchcond = state->matchcond;
  for (p = bp; p < ep; p++) {
    int c = bytemap[*p & 0xFF];
    uint32_t matchcond = nextmatchcond;
    uint32_t cond = state->action[c];

    // Determine whether we can reach act->next.
    // If so, advance state and nextmatchcond.
    if ((cond & kEmptyAllFlags) == 0 || Satisfy(cond, context, p)) {
      uint32_t nextindex = cond >> kIndexShift;
      state = IndexToNode(nodes, statesize, nextindex);
      nextmatchcond = state->matchcond;
    } else {
      state = NULL;
      nextmatchcond = kImpossible;
    }

    // This code section is carefully tuned.
    // The goto sequence is about 10% faster than the
    // obvious rewrite as a large if statement in the
    // ASCIIMatchRE2 and DotMatchRE2 benchmarks.

    // Saving the match capture registers is expensive.
    // Is this intermediate match worth thinking about?

    // Not if we want a full match.
    if (kind == kFullMatch)
      goto skipmatch;

    // Not if it's impossible.
    if (matchcond == kImpossible)
      goto skipmatch;

    // Not if the possible match is beaten by the certain
    // match at the next byte.  When this test is useless
    // (e.g., HTTPPartialMatchRE2) it slows the loop by
    // about 10%, but when it avoids work (e.g., DotMatchRE2),
    // it cuts the loop execution by about 45%.
    if ((cond & kMatchWins) == 0 && (nextmatchcond & kEmptyAllFlags) == 0)
      goto skipmatch;

    // Finally, the match conditions must be satisfied.
    if ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p)) {
      for (int i = 2; i < 2*nmatch; i++)
        matchcap[i] = cap[i];
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, matchcap, ncap);
      matchcap[1] = p;
      matched = true;

      // If we're in longest match mode, we have to keep
      // going and see if we find a longer match.
      // In first match mode, we can stop if the match
      // takes priority over the next state for this input byte.
      // That bit is per-input byte and thus in cond, not matchcond.
      if (kind == kFirstMatch && (cond & kMatchWins))
        goto done;
    }

  skipmatch:
    if (state == NULL)
      goto done;
    if ((cond & kCapMask) && nmatch > 1)
      ApplyCaptures(cond, p, cap, ncap);
  }

  // Look for match at end of input.
  {
    uint32_t matchcond = state->matchcond;
    if (matchcond != kImpossible &&
        ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p))) {
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, cap, ncap);
      for (int i = 2; i < ncap; i++)
        matchcap[i] = cap[i];
      matchcap[1] = p;
      matched = true;
    }
  }

done:
  if (!matched)
    return false;
  for (int i = 0; i < nmatch; i++)
    match[i] =
        StringPiece(matchcap[2 * i],
                    static_cast<size_t>(matchcap[2 * i + 1] - matchcap[2 * i]));
  return true;
}